

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

bool __thiscall QListWidgetItem::isSelected(QListWidgetItem *this)

{
  undefined1 uVar1;
  QListModel *__s;
  QItemSelectionModel *pQVar2;
  QModelIndex *pQVar3;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  Data *local_28;
  QListWidgetItem **local_20;
  
  local_20 = *(QListWidgetItem ***)(in_FS_OFFSET + 0x28);
  __s = listModel(this);
  if (__s != (QListModel *)0x0) {
    pQVar2 = QAbstractItemView::selectionModel((QAbstractItemView *)this->view);
    if (pQVar2 != (QItemSelectionModel *)0x0) {
      local_28 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      QListModel::index((QListModel *)&local_38,(char *)__s,(int)this);
      pQVar3 = (QModelIndex *)QAbstractItemView::selectionModel((QAbstractItemView *)this->view);
      uVar1 = QItemSelectionModel::isSelected(pQVar3);
      goto LAB_00587397;
    }
  }
  uVar1 = 0;
LAB_00587397:
  if (*(QListWidgetItem ***)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QListWidgetItem::isSelected() const
{
    const QListModel *model = listModel();
    if (!model || !view->selectionModel())
        return false;
    const QModelIndex index = model->index(this);
    return view->selectionModel()->isSelected(index);
}